

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

void __thiscall MeCab::anon_unknown_0::TaggerImpl::set_lattice_level(TaggerImpl *this,int level)

{
  if ((uint)level < 3) {
    this->request_type_ = this->request_type_ | *(uint *)(&DAT_0018298c + (ulong)(uint)level * 4);
  }
  return;
}

Assistant:

void TaggerImpl::set_lattice_level(int level) {
  switch (level) {
    case 0: request_type_ |= MECAB_ONE_BEST;
      break;
    case 1: request_type_ |= MECAB_NBEST;
      break;
    case 2: request_type_ |= MECAB_MARGINAL_PROB;
      break;
    default:
      break;
  }
}